

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

mpack_node_data_t * mpack_node_map_uint_impl(mpack_node_t node,uint64_t num)

{
  int iVar1;
  mpack_node_data_t *pmVar2;
  uint64_t uVar3;
  bool bVar4;
  ulong uVar5;
  mpack_tree_t *pmVar6;
  mpack_node_data_t *pmVar7;
  mpack_node_data_t *pmVar8;
  long lVar9;
  
  pmVar6 = node.tree;
  pmVar7 = node.data;
  if (pmVar6->error == mpack_ok) {
    if (pmVar7->type == mpack_type_map) {
      if (pmVar7->len != 0) {
        lVar9 = 0x10;
        uVar5 = 0;
        pmVar8 = (mpack_node_data_t *)0x0;
        do {
          pmVar2 = (pmVar7->value).children;
          iVar1 = *(int *)((long)&pmVar2[-1].type + lVar9);
          bVar4 = true;
          if (iVar1 == 3) {
            uVar3 = *(uint64_t *)((long)pmVar2 + lVar9 + -8);
            if (uVar3 == num && -1 < (long)uVar3) goto LAB_0010a331;
          }
          else if ((iVar1 == 4) && (*(uint64_t *)((long)pmVar2 + lVar9 + -8) == num)) {
LAB_0010a331:
            if (pmVar8 == (mpack_node_data_t *)0x0) {
              pmVar8 = (mpack_node_data_t *)((long)&pmVar2->type + lVar9);
            }
            else {
              if (pmVar6->error == mpack_ok) {
                pmVar6->error = mpack_error_data;
                if (pmVar6->error_fn != (mpack_tree_error_t)0x0) {
                  (*pmVar6->error_fn)(pmVar6,mpack_error_data);
                }
              }
              bVar4 = false;
            }
          }
          if (!bVar4) {
            return (mpack_node_data_t *)0x0;
          }
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + 0x20;
          if (pmVar7->len <= uVar5) {
            return pmVar8;
          }
        } while( true );
      }
    }
    else {
      pmVar6->error = mpack_error_type;
      if (pmVar6->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar6->error_fn)(pmVar6,mpack_error_type);
      }
    }
  }
  return (mpack_node_data_t *)0x0;
}

Assistant:

static mpack_node_data_t* mpack_node_map_uint_impl(mpack_node_t node, uint64_t num) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if ((key->type == mpack_type_uint && key->value.u == num) ||
            (key->type == mpack_type_int && key->value.i >= 0 && (uint64_t)key->value.i == num))
        {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}